

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *v2m,bool has_degen)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_108;
  undefined1 local_f8 [8];
  type f;
  LOs ev2v;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<double> out;
  LO na;
  bool has_degen_local;
  Reals *v2m_local;
  LOs *a2e_local;
  Mesh *mesh_local;
  ulong local_10;
  
  if (((ulong)(a2e->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2e->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2e->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._0_4_ = (int)(local_10 >> 2);
  size_in = (int)out.shared_alloc_.direct_ptr * 3;
  out.shared_alloc_.direct_ptr._7_1_ = has_degen;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<double>::Write((Write<double> *)local_68,size_in,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Mesh::ask_verts_of((Mesh *)&f.out.shared_alloc_.direct_ptr,(Int)mesh);
  Read<int>::Read((Read<int> *)local_f8,a2e);
  Read<int>::Read((Read<int> *)&f.a2e.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&f.out.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&f.ev2v.write_.shared_alloc_.direct_ptr,v2m);
  f.v2m.write_.shared_alloc_.direct_ptr._0_1_ = out.shared_alloc_.direct_ptr._7_1_ & 1;
  Write<double>::Write((Write<double> *)&f.has_degen,(Write<double> *)local_68);
  parallel_for<Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::_lambda(int)_1_>
            ((int)out.shared_alloc_.direct_ptr,(type *)local_f8,"get_mident_metrics");
  Write<double>::Write(&local_108,(Write<signed_char> *)local_68);
  Read<double>::Read((Read<double> *)this,&local_108);
  Write<double>::~Write(&local_108);
  get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_f8);
  Read<int>::~Read((Read<int> *)&f.out.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics_tmpl(
    Mesh* mesh, LOs a2e, Reals v2m, bool has_degen) {
  auto na = a2e.size();
  Write<Real> out(na * symm_ncomps(mdim));
  auto ev2v = mesh->ask_verts_of(edim);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    auto ms = gather_symms<edim + 1, mdim>(v2m, v);
    auto m = average_metric(ms, has_degen);
    set_symm(out, a, m);
  };
  parallel_for(na, f, "get_mident_metrics");
  return out;
}